

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_decoder.cc
# Opt level: O2

bool __thiscall
draco::MetadataDecoder::DecodeGeometryMetadata
          (MetadataDecoder *this,DecoderBuffer *in_buffer,GeometryMetadata *metadata)

{
  bool bVar1;
  __uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
  this_00;
  uint uVar2;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> att_metadata;
  uint32_t att_unique_id;
  uint32_t num_att_metadata;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> local_38;
  
  if (metadata == (GeometryMetadata *)0x0) {
LAB_0012ef6e:
    uVar2 = 0;
  }
  else {
    this->buffer_ = in_buffer;
    num_att_metadata = 0;
    bVar1 = DecodeVarint<unsigned_int>(&num_att_metadata,in_buffer);
    uVar2 = 0;
    if (bVar1) {
      for (; uVar2 < num_att_metadata; uVar2 = uVar2 + 1) {
        bVar1 = DecodeVarint<unsigned_int>(&att_unique_id,this->buffer_);
        if (!bVar1) goto LAB_0012ef6e;
        this_00.
        super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
        ._M_t.
        super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
        .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
             (__uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
              )operator_new(0x68);
        AttributeMetadata::AttributeMetadata
                  ((AttributeMetadata *)
                   this_00.
                   super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                   .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl);
        *(uint32_t *)
         ((long)this_00.
                super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                ._M_t.
                super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl + 0x60) =
             att_unique_id;
        att_metadata._M_t.
        super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
        ._M_t.
        super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
        .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
             (__uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
              )(__uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
                )this_00.
                 super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                 .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl;
        bVar1 = DecodeMetadata(this,(Metadata *)
                                    this_00.
                                    super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                                    .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>.
                                    _M_head_impl);
        if (!bVar1) {
          std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
          ::~unique_ptr(&att_metadata);
          goto LAB_0012ef6e;
        }
        local_38 = (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                    )(unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                      )att_metadata._M_t.
                       super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                       .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl;
        att_metadata._M_t.
        super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
        ._M_t.
        super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
        .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
             (__uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
              )(__uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                )0x0;
        GeometryMetadata::AddAttributeMetadata(metadata,&local_38);
        std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
        ~unique_ptr(&local_38);
        std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
        ~unique_ptr(&att_metadata);
      }
      bVar1 = DecodeMetadata(this,&metadata->super_Metadata);
      uVar2 = (uint)bVar1;
    }
  }
  return SUB41(uVar2,0);
}

Assistant:

bool MetadataDecoder::DecodeGeometryMetadata(DecoderBuffer *in_buffer,
                                             GeometryMetadata *metadata) {
  if (!metadata) {
    return false;
  }
  buffer_ = in_buffer;
  uint32_t num_att_metadata = 0;
  if (!DecodeVarint(&num_att_metadata, buffer_)) {
    return false;
  }
  // Decode attribute metadata.
  for (uint32_t i = 0; i < num_att_metadata; ++i) {
    uint32_t att_unique_id;
    if (!DecodeVarint(&att_unique_id, buffer_)) {
      return false;
    }
    std::unique_ptr<AttributeMetadata> att_metadata =
        std::unique_ptr<AttributeMetadata>(new AttributeMetadata());
    att_metadata->set_att_unique_id(att_unique_id);
    if (!DecodeMetadata(static_cast<Metadata *>(att_metadata.get()))) {
      return false;
    }
    metadata->AddAttributeMetadata(std::move(att_metadata));
  }
  return DecodeMetadata(static_cast<Metadata *>(metadata));
}